

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O2

double __thiscall
AbstractIsolineTracer<double>::determine_c_parametric(AbstractIsolineTracer<double> *this)

{
  ArrayXd *pAVar1;
  double dVar2;
  bool bVar3;
  Scalar *pSVar4;
  int i;
  long index;
  double dVar5;
  vector<double,_std::allocator<double>_> rhovec;
  ArrayXd newrho;
  vector<double,_std::allocator<double>_> f;
  Scalar local_40;
  CmpLTReturnType local_38;
  
  if (this->mode == STEP_PARAMETRIC) {
    pAVar1 = &(this->m_initial_state).rhovecL;
    std::vector<double,_std::allocator<double>_>::vector
              (&rhovec,(this->m_initial_state).rhovecL.
                       super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows * 2,(allocator_type *)&local_38);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)pAVar1,0);
    *rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)pAVar1,1);
    rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = *pSVar4;
    pAVar1 = &(this->m_initial_state).rhovecV;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)pAVar1,0);
    rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)pAVar1,1);
    rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = *pSVar4;
    std::vector<double,_std::allocator<double>_>::vector
              (&f,(long)rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_38);
    (*(this->super_AbstractODEIntegrator)._vptr_AbstractODEIntegrator[5])(this->m_T,this,&rhovec,&f)
    ;
    local_38.m_lhs._0_4_ = 4;
    Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array<int>(&newrho,(int *)&local_38);
    for (index = 0; index != 4; index = index + 1) {
      dVar5 = rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[index];
      dVar2 = f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[index];
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&newrho,index
                         );
      *pSVar4 = dVar2 * 1e-06 + dVar5;
    }
    local_40 = 0.0;
    Eigen::ArrayBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::operator<
              (&local_38,(ArrayBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&newrho,&local_40);
    bVar3 = Eigen::
            DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
            ::any((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                   *)&local_38);
    if (bVar3) {
      dVar5 = -1.0;
    }
    else {
      dVar5 = 1.0;
    }
    free(newrho.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&f.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rhovec.super__Vector_base<double,_std::allocator<double>_>);
  }
  else {
    dVar5 = 1.0;
  }
  return dVar5;
}

Assistant:

double determine_c_parametric() {
        if (mode == STEP_PARAMETRIC) {
            std::vector<TYPE> rhovec(m_initial_state.rhovecL.size()*2);
            rhovec[0] = m_initial_state.rhovecL[0];
            rhovec[1] = m_initial_state.rhovecL[1];
            rhovec[2] = m_initial_state.rhovecV[0];
            rhovec[3] = m_initial_state.rhovecV[1];
            std::vector<TYPE> f(rhovec.size());
            derivs(m_T, rhovec, f);
            double dt = 1e-6;
            Eigen::ArrayXd newrho(4);
            for (auto i = 0; i < 4; ++i) {
                newrho[i] = rhovec[i] + dt * f[i];
            }
            if ((newrho < 0).any()) {
                return -1;
            }
            else{
                return 1;
            }
        }
        else {
            return 1.0;
        }
    }